

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O1

void __thiscall Refal2::CScanner::CScanner(CScanner *this,IErrorHandler *errorHandler)

{
  CParser::CParser(&this->super_CParser,errorHandler);
  CParser::Reset(&this->super_CParser);
  this->line = 1;
  this->position = 1;
  this->afterCarriageReturn = false;
  this->preprocessingState = PS_Initial;
  this->savedPreprocessingState = PS_Initial;
  this->state = S_Initial;
  return;
}

Assistant:

CScanner::CScanner( IErrorHandler* errorHandler ) :
	CParser( errorHandler )
{
	Reset();
}